

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void duckdb::QuantileListOperation<float,false>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<float,duckdb::QuantileStandardType>>
               (QuantileState<float,_duckdb::QuantileStandardType> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  AggregateInputData *this;
  data_ptr_t pdVar2;
  float *v_t;
  _func_int **pp_Var3;
  double dVar4;
  Vector *pVVar5;
  idx_t iVar6;
  reference pvVar7;
  unsigned_long *q;
  _func_int **pp_Var8;
  FunctionData *pFVar9;
  uint64_t uVar10;
  ulong uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  QuantileDirect<float> local_a9;
  FunctionData *local_a8;
  list_entry_t *local_a0;
  AggregateFinalizeData *local_98;
  Vector *local_90;
  data_ptr_t local_88;
  vector<duckdb::QuantileValue,_true> *local_80;
  Interpolator<false> local_78;
  double local_48;
  double dStack_40;
  
  if ((state->v).super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar9 = (this->bind_data).ptr;
    pVVar5 = ListVector::GetEntry(finalize_data->result);
    iVar6 = ListVector::GetListSize(finalize_data->result);
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar9[2]._vptr_FunctionData - (long)pFVar9[1]._vptr_FunctionData >>
                        3) * 0x4ec4ec4ec4ec4ec5 + iVar6);
    pdVar2 = pVVar5->data;
    v_t = (state->v).super_vector<float,_std::allocator<float>_>.
          super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    ;
    target->offset = iVar6;
    pp_Var8 = pFVar9[4]._vptr_FunctionData;
    pp_Var3 = pFVar9[5]._vptr_FunctionData;
    if (pp_Var8 != pp_Var3) {
      local_80 = (vector<duckdb::QuantileValue,_true> *)(pFVar9 + 1);
      local_88 = pdVar2 + iVar6 * 4;
      uVar11 = 0;
      local_a8 = pFVar9;
      local_a0 = target;
      local_98 = finalize_data;
      local_90 = pVVar5;
      do {
        pvVar7 = vector<duckdb::QuantileValue,_true>::operator[](local_80,(size_type)*pp_Var8);
        iVar6 = (long)(state->v).super_vector<float,_std::allocator<float>_>.
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(state->v).super_vector<float,_std::allocator<float>_>.
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        local_78.desc = *(bool *)&local_a8[7]._vptr_FunctionData;
        lVar1 = iVar6 - 1;
        auVar13._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar13._0_8_ = lVar1;
        auVar13._12_4_ = 0x45300000;
        dStack_40 = auVar13._8_8_ - 1.9342813113834067e+25;
        local_78.RN = (dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                      pvVar7->dbl;
        local_48 = local_78.RN;
        dVar4 = floor(local_78.RN);
        local_78.FRN = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
        dVar4 = ceil(local_48);
        local_78.CRN = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
        local_78.begin = uVar11;
        local_78.end = iVar6;
        fVar12 = Interpolator<false>::Operation<float,float,duckdb::QuantileDirect<float>>
                           (&local_78,v_t,local_90,&local_a9);
        *(float *)(local_88 + (long)*pp_Var8 * 4) = fVar12;
        pp_Var8 = pp_Var8 + 1;
        uVar11 = local_78.FRN;
      } while (pp_Var8 != pp_Var3);
      iVar6 = local_a0->offset;
      pFVar9 = local_a8;
      target = local_a0;
      finalize_data = local_98;
    }
    uVar10 = ((long)pFVar9[2]._vptr_FunctionData - (long)pFVar9[1]._vptr_FunctionData >> 3) *
             0x4ec4ec4ec4ec4ec5;
    target->length = uVar10;
    ListVector::SetListSize(finalize_data->result,uVar10 + iVar6);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}